

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O3

PAL_ERROR __thiscall
CorUnix::CSynchData::AssignOwnershipToThread
          (CSynchData *this,CPalThread *pthrCurrent,CPalThread *pthrTarget)

{
  LONG LVar1;
  PAL_ERROR PVar2;
  _OwnedObjectsListNode *local_38;
  _OwnedObjectsListNode *pObj;
  
  if (CObjectType::s_rgotIdMapping[this->m_otiObjectTypeId]->m_eOwnershipSemantics !=
      OwnershipTracked) {
    fprintf(_stderr,"] %s %s:%d","AssignOwnershipToThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x6cb);
    fprintf(_stderr,
            "Expression: CObjectType::OwnershipTracked == GetObjectType()->GetOwnershipSemantics(), Description: AssignOwnershipToThread called on a non-ownable CSynchData [this=%p OwnershipSemantics=%u]\n"
            ,this,(ulong)CObjectType::s_rgotIdMapping[this->m_otiObjectTypeId]->
                         m_eOwnershipSemantics);
  }
  if (this->m_lOwnershipCount < 1) {
    local_38 = (POwnedObjectsListNode)0x0;
    CSynchCache<CorUnix::_OwnedObjectsListNode>::Get
              ((CSynchCache<CorUnix::_OwnedObjectsListNode> *)
               (CPalSynchronizationManager::s_pObjSynchMgr + 0x4d8),pthrCurrent,1,&local_38);
    if (local_38 != (POwnedObjectsListNode)0x0) {
      if (PAL_InitializeChakraCoreCalled != false) {
        this->m_dwOwnerPid = gPID;
        this->m_dwOwnerTid = (DWORD)pthrTarget->m_threadId;
        this->m_pOwnerThread = pthrTarget;
        this->m_poolnOwnedObjectListNode = local_38;
        this->m_lOwnershipCount = 1;
        this->m_fAbandoned = false;
        local_38->pPalObjSynchData = this;
        LOCK();
        this->m_lRefCount = this->m_lRefCount + 1;
        UNLOCK();
        CThreadSynchronizationInfo::AddObjectToOwnedList(&pthrTarget->synchronizationInfo,local_38);
        return 0;
      }
      goto LAB_0015279b;
    }
    PVar2 = 8;
  }
  else {
    LVar1 = GetSignalCount(this);
    if (LVar1 != 0) {
      fprintf(_stderr,"] %s %s:%d","AssignOwnershipToThread",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
              ,0x6d4);
      fprintf(_stderr,
              "Expression: 0 == GetSignalCount(), Description: Conflicting OwnershipCount and SignalCount values\n"
             );
    }
    if ((this->m_pOwnerThread != pthrTarget) || (gPID != this->m_dwOwnerPid)) {
      fprintf(_stderr,"] %s %s:%d","AssignOwnershipToThread",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
              ,0x6db);
      fprintf(_stderr,
              "Expression: pthrTarget == m_pOwnerThread && gPID == m_dwOwnerPid, Description: Attempting to assign ownership of CSynchData %p to thread {pid=%#x tid=%#x} while it is currently owned by thread {pid=%#x tid=%#x}\n"
              ,this,(ulong)gPID,pthrTarget->m_threadId,(ulong)this->m_dwOwnerPid,
              this->m_pOwnerThread->m_threadId);
    }
    this->m_lOwnershipCount = this->m_lOwnershipCount + 1;
    PVar2 = 0;
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return PVar2;
  }
LAB_0015279b:
  abort();
}

Assistant:

PAL_ERROR CSynchData::AssignOwnershipToThread(
        CPalThread * pthrCurrent,
        CPalThread * pthrTarget)
    {
        // Note: when this method is called by ReleaseFirstWaiter there is
        //       a small time window in which both SignalCount and 
        //       OwnershipCount can be greater than zero (which normally
        //       is illegal). Anyway that is fine since ReleaseFirstWaiter 
        //       will restore the value right after, and such situation
        //       takes place while holding synchroniztion locks, so no
        //       other thread/process can access the object.
                
        PAL_ERROR palErr = NO_ERROR;
        
        _ASSERT_MSG(CObjectType::OwnershipTracked ==
                    GetObjectType()->GetOwnershipSemantics(),
                    "AssignOwnershipToThread called on a non-ownable "
                    "CSynchData [this=%p OwnershipSemantics=%u]\n", this,
                    GetObjectType()->GetOwnershipSemantics());
        

        if (0 < m_lOwnershipCount)
        {
            //
            // Object already owned, incrementing ownership count
            //
            _ASSERT_MSG(0 == GetSignalCount(),
                        "Conflicting OwnershipCount and SignalCount values\n");
            
            _ASSERT_MSG(pthrTarget == m_pOwnerThread && gPID == m_dwOwnerPid,
                        "Attempting to assign ownership of CSynchData %p to "
                        "thread {pid=%#x tid=%#x} while it is currently owned "
                        "by thread {pid=%#x tid=%#x}\n", this,
                        gPID, pthrTarget->GetThreadId(),
                        m_dwOwnerPid, m_pOwnerThread->GetThreadId());

            m_lOwnershipCount++;

            TRACE("Incrementing ownership count for object with "
                  "SynchData %p owned by thread %#x [new count=%d]\n",
                  this, pthrTarget->GetThreadId(), m_lOwnershipCount);
        }
        else
        {
            //
            // Acquiring currently not owned object
            //            
            CPalSynchronizationManager * pSynchManager = 
                CPalSynchronizationManager::GetInstance();
            OwnedObjectsListNode * pooln;

            pooln = pSynchManager->CacheGetOwnedObjsListNode(pthrCurrent);
            if (NULL == pooln)
            {
                ERROR("Out of memory while acquiring mutex ownership");                
                // In this case we bail out. It will result in no
                // thread being awakend, which may cause deadlock,
                // but it is anyway better than corrupting the 
                // ownership list
                palErr = ERROR_NOT_ENOUGH_MEMORY;
                goto AOTT_exit;
            } 

            TRACE("Assigning ownable object with SynchData %p to "
                  "thread %#x\n",
                  this, pthrTarget->GetThreadId());

            // Set ownership data
            SetOwner(pthrTarget);
            SetOwnershipListNode(pooln);
            SetOwnershipCount(1);
            SetAbandoned(false);

            // Add object to list of owned objs for current thread
            pooln->pPalObjSynchData = this;
            AddRef();
            pthrTarget->synchronizationInfo.AddObjectToOwnedList(pooln);
        }
        
    AOTT_exit:
        return palErr;
    }